

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

SpatialAcc *
iDynTree::convertMixedAccelerationToBodyFixedAcceleration
          (SpatialAcc *__return_storage_ptr__,Vector6 *mixedAcc,Twist *bodyFixedVel,
          Rotation *inertial_R_body)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  SpatialAcc *bodyFixedAcc;
  
  bodyFixedAcc = __return_storage_ptr__;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] = 0.0;
  dVar1 = *(double *)bodyFixedVel;
  dVar2 = *(double *)(bodyFixedVel + 0x18);
  dVar10 = *(double *)(bodyFixedVel + 0x20);
  dVar11 = *(double *)(bodyFixedVel + 0x28);
  dVar12 = *(double *)(bodyFixedVel + 8);
  dVar13 = *(double *)(bodyFixedVel + 0x10);
  dVar3 = mixedAcc->m_data[0];
  dVar4 = mixedAcc->m_data[1];
  dVar14 = *(double *)inertial_R_body;
  dVar15 = *(double *)(inertial_R_body + 8);
  dVar16 = *(double *)(inertial_R_body + 0x18);
  dVar17 = *(double *)(inertial_R_body + 0x20);
  dVar18 = *(double *)(inertial_R_body + 0x30);
  dVar19 = *(double *)(inertial_R_body + 0x38);
  dVar5 = mixedAcc->m_data[2];
  dVar6 = *(double *)(inertial_R_body + 0x10);
  dVar7 = *(double *)(inertial_R_body + 0x28);
  dVar8 = *(double *)(inertial_R_body + 0x40);
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       (dVar5 * dVar18 + dVar4 * dVar16 + dVar3 * dVar14) - (dVar13 * dVar10 - dVar11 * dVar12);
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       (dVar5 * dVar19 + dVar4 * dVar17 + dVar3 * dVar15) - (dVar1 * dVar11 - dVar2 * dVar13);
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       (dVar5 * dVar8 + dVar4 * dVar7 + dVar3 * dVar6) - (dVar2 * dVar12 - dVar1 * dVar10);
  dVar1 = mixedAcc->m_data[3];
  dVar2 = mixedAcc->m_data[4];
  dVar3 = mixedAcc->m_data[5];
  dVar4 = dVar3 * dVar19 + dVar2 * dVar17 + dVar1 * dVar15;
  auVar9._8_4_ = SUB84(dVar4,0);
  auVar9._0_8_ = dVar3 * dVar18 + dVar2 * dVar16 + dVar1 * dVar14;
  auVar9._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_SpatialMotionVector).
   super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data = auVar9;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] =
       dVar8 * dVar3 + dVar7 * dVar2 + dVar6 * dVar1;
  return bodyFixedAcc;
}

Assistant:

SpatialAcc convertMixedAccelerationToBodyFixedAcceleration(const Vector6 & mixedAcc,
                                                           const Twist & bodyFixedVel,
                                                           const Rotation & inertial_R_body)
{
    SpatialAcc bodyFixedAcc;

    Eigen::Map<const Eigen::Vector3d> linMixedAcc(mixedAcc.data());
    Eigen::Map<const Eigen::Vector3d> angMixedAcc(mixedAcc.data()+3);

    Eigen::Map<const Eigen::Vector3d> linBodyFixedTwist(bodyFixedVel.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angBodyFixedTwist(bodyFixedVel.getAngularVec3().data());

    Eigen::Map<const Matrix3dRowMajor> inertial_R_body_eig(inertial_R_body.data());

    Eigen::Map<Eigen::Vector3d> linBodyFixedAcc(bodyFixedAcc.getLinearVec3().data());
    Eigen::Map<Eigen::Vector3d> angBodyFixedAcc(bodyFixedAcc.getAngularVec3().data());

    linBodyFixedAcc = inertial_R_body_eig.transpose()*linMixedAcc - angBodyFixedTwist.cross(linBodyFixedTwist);
    angBodyFixedAcc = inertial_R_body_eig.transpose()*angMixedAcc;

    return bodyFixedAcc;
}